

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O1

void __thiscall
hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(ValueKnowledge *this,int value)

{
  uint uVar1;
  ulong *puVar2;
  ulong *puVar3;
  
  if (-1 < value) {
    puVar3 = (this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    puVar2 = (this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar1 = (this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    if ((ulong)(uint)value < (ulong)uVar1 + ((long)puVar2 - (long)puVar3) * 8) {
      if (this->value_ != value && -1 < this->value_) {
        __assert_fail("value_ < 0 || value_ == value",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                      ,0x1f,
                      "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(int)")
        ;
      }
      if ((puVar3[(uint)value >> 6] >> ((ulong)(uint)value & 0x3f) & 1) == 0) {
        __assert_fail("value_plausible_[value] == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                      ,0x20,
                      "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(int)")
        ;
      }
      this->value_ = value;
      if (puVar3 != puVar2) {
        memset(puVar3,0,(long)puVar2 - (long)puVar3);
        puVar3 = puVar2;
      }
      if (uVar1 != 0) {
        *puVar3 = *puVar3 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
      }
      puVar3 = (this->value_plausible_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + ((uint)value >> 6);
      *puVar3 = *puVar3 | 1L << ((byte)value & 0x3f);
      return;
    }
  }
  __assert_fail("value >= 0 && value < value_plausible_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                ,0x1e,"void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsValueHint(int)")
  ;
}

Assistant:

void HanabiHand::ValueKnowledge::ApplyIsValueHint(int value) {
  assert(value >= 0 && value < value_plausible_.size());
  assert(value_ < 0 || value_ == value);
  assert(value_plausible_[value] == true);
  value_ = value;
  std::fill(value_plausible_.begin(), value_plausible_.end(), false);
  value_plausible_[value] = true;
}